

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.pb.cc
# Opt level: O2

bool CoreML::Specification::OneHotEncoder_HandleUnknown_Parse
               (ConstStringParam name,OneHotEncoder_HandleUnknown *value)

{
  bool bVar1;
  int int_value;
  StringPiece local_20;
  
  google::protobuf::stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_20,name);
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((EnumEntry *)OneHotEncoder_HandleUnknown_entries,2,local_20,&int_value);
  if (bVar1) {
    *value = int_value;
  }
  return bVar1;
}

Assistant:

bool OneHotEncoder_HandleUnknown_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, OneHotEncoder_HandleUnknown* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      OneHotEncoder_HandleUnknown_entries, 2, name, &int_value);
  if (success) {
    *value = static_cast<OneHotEncoder_HandleUnknown>(int_value);
  }
  return success;
}